

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOCC-CTA-cs16btech11038.cpp
# Opt level: O1

void __thiscall BOCC_CTA::garbageCollect(BOCC_CTA *this)

{
  key_type pTVar1;
  mapped_type pTVar2;
  pointer piVar3;
  char cVar4;
  _Base_ptr p_Var5;
  mapped_type *ppTVar6;
  set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_> *this_00;
  __node_base _Var7;
  _Hash_node_base *p_Var8;
  pair<std::_Rb_tree_iterator<Transaction_*>,_std::_Rb_tree_iterator<Transaction_*>_> pVar9;
  int e;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> freeables;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_70;
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_bucket_count = 1;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._4_4_ = 0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  for (p_Var8 = (this->transactions)._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
      p_Var8 = p_Var8->_M_nxt) {
    cVar4 = Transaction::getStatus((Transaction *)p_Var8[2]._M_nxt);
    if (cVar4 != 's') {
      pTVar1 = (key_type)p_Var8[2]._M_nxt;
      for (p_Var5 = (pTVar1->readSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(pTVar1->readSet)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
        this_00 = &(this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[(int)p_Var5[1]._M_color]->read_list;
        pVar9 = std::
                _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
                ::equal_range(&this_00->_M_t,(key_type *)(p_Var8 + 2));
        std::
        _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar9.first._M_node,(_Base_ptr)pVar9.second._M_node
                      );
      }
      local_70 = &local_68;
      std::
      _Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<int,false>>>>
                ((_Hashtable<int,int,std::allocator<int>,std::__detail::_Identity,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_70,p_Var8 + 1,&local_70);
    }
  }
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var7._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      local_70 = (_Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)CONCAT44(local_70._4_4_,*(undefined4 *)&_Var7._M_nxt[1]._M_nxt);
      ppTVar6 = std::__detail::
                _Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&this->transactions,(key_type *)&local_70);
      pTVar2 = *ppTVar6;
      if (pTVar2 != (mapped_type)0x0) {
        piVar3 = (pTVar2->local_write_store).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar3 != (pointer)0x0) {
          operator_delete(piVar3,(long)(pTVar2->local_write_store).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)piVar3);
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&(pTVar2->readSet)._M_t);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&(pTVar2->writeSet)._M_t);
        operator_delete(pTVar2,0xc0);
      }
      std::
      _Hashtable<int,_std::pair<const_int,_Transaction_*>,_std::allocator<std::pair<const_int,_Transaction_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->transactions)._M_h,&local_70);
      _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
    } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void BOCC_CTA::garbageCollect() {
    std::unordered_set<int> freeables{};

    for(auto& [k, v]: transactions){
        // dont need to process still ongoing transactions!
        if(v->getStatus()=='s') continue;

        // remove this transaction from any read_lists!
        for(auto i: v->readSet){
            dataItems[i]->read_list.erase(v);
        }

        // remove this transaction from the hashmap.
        //transactions.erase(k);
        freeables.insert(k);
    }

    for(auto e: freeables) {delete transactions[e];transactions.erase(e);}
}